

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O3

string * toCamelCase(string *__return_storage_ptr__,string *value,bool keepSeparatedNumbersSeparated
                    )

{
  size_type __res;
  pointer pcVar1;
  char __c;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  __res = value->_M_string_length;
  if ((__res != 0) &&
     (iVar4 = (int)*(value->_M_dataplus)._M_p, iVar2 = isupper(iVar4),
     9 < iVar4 - 0x30U && iVar2 == 0)) {
    __assert_fail("value.empty() || isupper( value[0] ) || isdigit( value[0] )",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/XMLHelper.hpp"
                  ,0x1bb,"std::string toCamelCase(const std::string &, bool)");
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,__res);
  uVar3 = value->_M_string_length;
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      pcVar1 = (value->_M_dataplus)._M_p;
      __c = pcVar1[uVar5];
      if (__c == 0x5f) {
        if ((((uVar5 != 0 && keepSeparatedNumbersSeparated) && (uVar5 < uVar3 - 1)) &&
            ((int)pcVar1[uVar5 - 1] - 0x30U < 10)) &&
           (__c = '_', (int)pcVar1[uVar5 + 1] - 0x30U < 10)) goto LAB_001efdc4;
      }
      else {
        if ((uVar5 != 0) && (9 < (int)pcVar1[uVar5 - 1] - 0x30U && pcVar1[uVar5 - 1] != '_')) {
          iVar2 = tolower((int)__c);
          __c = (char)iVar2;
        }
LAB_001efdc4:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,__c);
      }
      uVar5 = uVar5 + 1;
      uVar3 = value->_M_string_length;
    } while (uVar5 < uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string toCamelCase( std::string const & value, bool keepSeparatedNumbersSeparated )
{
  assert( value.empty() || isupper( value[0] ) || isdigit( value[0] ) );
  std::string result;
  result.reserve( value.size() );
  for ( size_t i = 0; i < value.size(); ++i )
  {
    if ( value[i] == '_' )
    {
      if ( keepSeparatedNumbersSeparated && ( 0 < i ) && isdigit( value[i - 1] ) && ( i < value.size() - 1 ) && isdigit( value[i + 1] ) )
      {
        result.push_back( '_' );
      }
    }
    else
    {
      result.push_back( ( ( 0 == i ) || ( value[i - 1] == '_' ) || isdigit( value[i - 1] ) ) ? value[i] : static_cast<char>( tolower( value[i] ) ) );
    }
  }
  return result;
}